

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O2

void __thiscall
pbrt::RayIntegrator::RayIntegrator
          (RayIntegrator *this,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights)

{
  _Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> _Stack_58;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_40;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_38;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_30;
  
  local_30.bits =
       (camera->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_38.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_40.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&_Stack_58,lights);
  ImageTileIntegrator::ImageTileIntegrator
            (&this->super_ImageTileIntegrator,(CameraHandle *)&local_30,(SamplerHandle *)&local_38,
             (PrimitiveHandle *)&local_40,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&_Stack_58);
  std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
            (&_Stack_58);
  (this->super_ImageTileIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__Integrator_02eeec80;
  return;
}

Assistant:

RayIntegrator(CameraHandle camera, SamplerHandle sampler, PrimitiveHandle aggregate,
                  std::vector<LightHandle> lights)
        : ImageTileIntegrator(camera, sampler, aggregate, lights) {}